

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AudioDataGeneration.cpp
# Opt level: O2

double __thiscall soul::WaveGenerators::Square::getSample(Square *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar2 = (this->super_Blep).super_Generator.currentPhase;
  dVar1 = *(double *)(&DAT_002a06b0 + (ulong)(dVar2 < 0.5) * 8);
  dVar2 = Blep::blep(&this->super_Blep,dVar2);
  dVar3 = fmod((this->super_Blep).super_Generator.currentPhase + 0.5,1.0);
  dVar3 = Blep::blep(&this->super_Blep,dVar3);
  return dVar3 + (dVar1 - dVar2);
}

Assistant:

double getSample() override
        {
            return (currentPhase < 0.5 ? -1.0f : 1.0f) - blep (currentPhase)
                    + blep (std::fmod (currentPhase + 0.5, 1.0));
        }